

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.h
# Opt level: O1

void __thiscall Symbol::~Symbol(Symbol *this)

{
  ~Symbol(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

~Symbol(){}